

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O1

Wrench * iDynTree::transformWrenchEfficient<iDynTree::Wrench>
                   (Wrench *__return_storage_ptr__,Transform *op1,Wrench *op2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  Wrench *ret;
  ActualDstType actualDst;
  
  ret = __return_storage_ptr__;
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialForceVector)._vptr_SpatialForceVector =
       (_func_int **)&PTR__SpatialForceVector_0015fc30;
  dVar4 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
          linearVec3.super_Vector3.m_data[0];
  dVar5 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
          linearVec3.super_Vector3.m_data[1];
  dVar8 = (op1->rot).super_Matrix3x3.m_data[0];
  dVar9 = (op1->rot).super_Matrix3x3.m_data[1];
  dVar10 = (op1->rot).super_Matrix3x3.m_data[2];
  dVar11 = (op1->rot).super_Matrix3x3.m_data[3];
  dVar12 = (op1->rot).super_Matrix3x3.m_data[4];
  dVar13 = (op1->rot).super_Matrix3x3.m_data[6];
  dVar14 = (op1->rot).super_Matrix3x3.m_data[7];
  dVar1 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
          linearVec3.super_Vector3.m_data[2];
  dVar2 = (op1->rot).super_Matrix3x3.m_data[5];
  dVar3 = (op1->rot).super_Matrix3x3.m_data[8];
  dVar7 = dVar1 * dVar3 + dVar5 * dVar14 + dVar4 * dVar13;
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.super_Vector3.m_data[0] =
       dVar1 * dVar10 + dVar9 * dVar5 + dVar8 * dVar4;
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.super_Vector3.m_data[1] =
       dVar1 * dVar2 + dVar5 * dVar12 + dVar4 * dVar11;
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.super_Vector3.m_data[2] = dVar7;
  dVar1 = (__return_storage_ptr__->super_SpatialForceVector).
          super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.super_Vector3.m_data[0];
  dVar4 = (__return_storage_ptr__->super_SpatialForceVector).
          super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.super_Vector3.m_data[1];
  dVar5 = (op1->pos).super_Vector3.m_data[0];
  dVar15 = (op1->pos).super_Vector3.m_data[1];
  dVar16 = (op1->pos).super_Vector3.m_data[2];
  dVar17 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
           angularVec3.super_Vector3.m_data[0];
  dVar18 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
           angularVec3.super_Vector3.m_data[1];
  dVar6 = (op2->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.
          angularVec3.super_Vector3.m_data[2];
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.super_Vector3.m_data[0] =
       dVar6 * dVar10 + dVar9 * dVar18 + dVar8 * dVar17 + (dVar7 * dVar15 - dVar4 * dVar16);
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.super_Vector3.m_data[1] =
       dVar6 * dVar2 + dVar12 * dVar18 + dVar11 * dVar17 + (dVar1 * dVar16 - dVar7 * dVar5);
  (__return_storage_ptr__->super_SpatialForceVector).
  super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3.super_Vector3.m_data[2] =
       (dVar5 * dVar4 - dVar1 * dVar15) + dVar14 * dVar18 + dVar13 * dVar17 + dVar3 * dVar6;
  return ret;
}

Assistant:

spatialForceType transformWrenchEfficient(const Transform& op1, const spatialForceType& op2)
    {
        spatialForceType ret;

        Eigen::Map<const Eigen::Vector3d> p(op1.getPosition().data());
        Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(op1.getRotation().data());

        toEigen(ret.getLinearVec3()) = R*toEigen(op2.getLinearVec3());
        toEigen(ret.getAngularVec3())  = R*toEigen(op2.getAngularVec3()) + p.cross(toEigen(ret.getLinearVec3()));

        return ret;
    }